

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall HighsPrimalHeuristics::flushStatistics(HighsPrimalHeuristics *this)

{
  long lVar1;
  pointer pHVar2;
  long in_RDI;
  
  lVar1 = *(long *)(in_RDI + 8);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x67611a);
  pHVar2->total_repair_lp = lVar1 + pHVar2->total_repair_lp;
  lVar1 = *(long *)(in_RDI + 0x10);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x67614c);
  pHVar2->total_repair_lp_feasible = lVar1 + pHVar2->total_repair_lp_feasible;
  lVar1 = *(long *)(in_RDI + 0x18);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x67617f);
  pHVar2->total_repair_lp_iterations = lVar1 + pHVar2->total_repair_lp_iterations;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  lVar1 = *(long *)(in_RDI + 0x20);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6761ca);
  pHVar2->heuristic_lp_iterations = lVar1 + pHVar2->heuristic_lp_iterations;
  lVar1 = *(long *)(in_RDI + 0x20);
  pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6761fd);
  pHVar2->total_lp_iterations = lVar1 + pHVar2->total_lp_iterations;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  return;
}

Assistant:

void HighsPrimalHeuristics::flushStatistics() {
  mipsolver.mipdata_->total_repair_lp += total_repair_lp;
  mipsolver.mipdata_->total_repair_lp_feasible += total_repair_lp_feasible;
  mipsolver.mipdata_->total_repair_lp_iterations += total_repair_lp_iterations;
  total_repair_lp = 0;
  total_repair_lp_feasible = 0;
  total_repair_lp_iterations = 0;
  mipsolver.mipdata_->heuristic_lp_iterations += lp_iterations;
  mipsolver.mipdata_->total_lp_iterations += lp_iterations;
  lp_iterations = 0;
}